

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

string * __thiscall
BamTools::Internal::BamWriterPrivate::GetErrorString_abi_cxx11_(BamWriterPrivate *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x48));
  return in_RDI;
}

Assistant:

std::string BamWriterPrivate::GetErrorString() const
{
    return m_errorString;
}